

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_adaptor.hpp
# Opt level: O2

void __thiscall
io::basic_adaptor<io::basic_string_stream<char,std::char_traits<char>>>::
basic_adaptor<char_const(&)[12],void>
          (basic_adaptor<io::basic_string_stream<char,std::char_traits<char>>> *this,
          char (*args) [12])

{
  allocator<char> local_31;
  string_type local_30;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,*args,&local_31);
  basic_string_stream<char,_std::char_traits<char>_>::basic_string_stream
            ((basic_string_stream<char,_std::char_traits<char>_> *)this,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

basic_adaptor(Args&&... args)
            : stream_(std::forward<Args>(args)...)
    {}